

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable.hxx
# Opt level: O0

size_type __thiscall
cmsys::
hashtable<std::pair<const_char_*const,_int>,_const_char_*,_cmsys::hash<const_char_*>,_cmsys::hash_select1st<const_char_*const,_int>,_std::equal_to<const_char_*>,_std::allocator<char>_>
::erase(hashtable<std::pair<const_char_*const,_int>,_const_char_*,_cmsys::hash<const_char_*>,_cmsys::hash_select1st<const_char_*const,_int>,_std::equal_to<const_char_*>,_std::allocator<char>_>
        *this,key_type *__key)

{
  _Node *__n_00;
  _Hashtable_node<std::pair<const_char_*const,_int>_> *p_Var1;
  bool bVar2;
  size_type __n_01;
  reference pp_Var3;
  char **ppcVar4;
  _Node *local_40;
  _Node *__next;
  _Node *__cur;
  size_type __erased;
  _Node *__first;
  size_type __n;
  key_type *__key_local;
  hashtable<std::pair<const_char_*const,_int>,_const_char_*,_cmsys::hash<const_char_*>,_cmsys::hash_select1st<const_char_*const,_int>,_std::equal_to<const_char_*>,_std::allocator<char>_>
  *this_local;
  
  __n_01 = _M_bkt_num_key(this,__key);
  pp_Var3 = std::
            vector<cmsys::_Hashtable_node<std::pair<const_char_*const,_int>_>_*,_std::allocator<cmsys::_Hashtable_node<std::pair<const_char_*const,_int>_>_*>_>
            ::operator[](&this->_M_buckets,__n_01);
  __n_00 = *pp_Var3;
  __cur = (_Node *)0x0;
  if (__n_00 != (_Node *)0x0) {
    local_40 = __n_00->_M_next;
    __next = __n_00;
    while (local_40 != (_Node *)0x0) {
      ppcVar4 = hash_select1st<const_char_*const,_int>::operator()
                          ((hash_select1st<const_char_*const,_int> *)&this->field_0x3,
                           &local_40->_M_val);
      bVar2 = std::equal_to<const_char_*>::operator()
                        ((equal_to<const_char_*> *)&this->field_0x2,ppcVar4,__key);
      if (bVar2) {
        __next->_M_next = local_40->_M_next;
        _M_delete_node(this,local_40);
        local_40 = __next->_M_next;
        __cur = (_Node *)((long)&__cur->_M_next + 1);
        this->_M_num_elements = this->_M_num_elements - 1;
      }
      else {
        __next = local_40;
        local_40 = local_40->_M_next;
      }
    }
    ppcVar4 = hash_select1st<const_char_*const,_int>::operator()
                        ((hash_select1st<const_char_*const,_int> *)&this->field_0x3,&__n_00->_M_val)
    ;
    bVar2 = std::equal_to<const_char_*>::operator()
                      ((equal_to<const_char_*> *)&this->field_0x2,ppcVar4,__key);
    if (bVar2) {
      p_Var1 = __n_00->_M_next;
      pp_Var3 = std::
                vector<cmsys::_Hashtable_node<std::pair<const_char_*const,_int>_>_*,_std::allocator<cmsys::_Hashtable_node<std::pair<const_char_*const,_int>_>_*>_>
                ::operator[](&this->_M_buckets,__n_01);
      *pp_Var3 = p_Var1;
      _M_delete_node(this,__n_00);
      __cur = (_Node *)((long)&__cur->_M_next + 1);
      this->_M_num_elements = this->_M_num_elements - 1;
    }
  }
  return (size_type)__cur;
}

Assistant:

typename hashtable<_Val,_Key,_HF,_Ex,_Eq,_All>::size_type
hashtable<_Val,_Key,_HF,_Ex,_Eq,_All>::erase(const key_type& __key)
{
  const size_type __n = _M_bkt_num_key(__key);
  _Node* __first = _M_buckets[__n];
  size_type __erased = 0;

  if (__first) {
    _Node* __cur = __first;
    _Node* __next = __cur->_M_next;
    while (__next) {
      if (_M_equals(_M_get_key(__next->_M_val), __key)) {
        __cur->_M_next = __next->_M_next;
        _M_delete_node(__next);
        __next = __cur->_M_next;
        ++__erased;
        --_M_num_elements;
      }
      else {
        __cur = __next;
        __next = __cur->_M_next;
      }
    }
    if (_M_equals(_M_get_key(__first->_M_val), __key)) {
      _M_buckets[__n] = __first->_M_next;
      _M_delete_node(__first);
      ++__erased;
      --_M_num_elements;
    }
  }
  return __erased;
}